

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

size_type __thiscall lf::mesh::hybrid2d::Mesh::NumEntities(Mesh *this,RefEl ref_el_type)

{
  RefElType RVar1;
  size_type sVar2;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Mesh *local_18;
  Mesh *this_local;
  RefEl ref_el_type_local;
  
  local_18 = this;
  this_local._3_1_ = ref_el_type.type_;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 3));
  switch(RVar1) {
  case kPoint:
    sVar2 = std::vector<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>::size
                      (&this->points_);
    this_local._4_4_ = (size_type)sVar2;
    break;
  case kSegment:
    sVar2 = std::vector<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>::
            size(&this->segments_);
    this_local._4_4_ = (size_type)sVar2;
    break;
  case kTria:
    sVar2 = std::vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
            ::size(&this->trias_);
    this_local._4_4_ = (size_type)sVar2;
    break;
  case kQuad:
    sVar2 = std::
            vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
            ::size(&this->quads_);
    this_local._4_4_ = (size_type)sVar2;
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Illegal entity type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"false",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x4d,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x4d,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  return this_local._4_4_;
}

Assistant:

Mesh::size_type Mesh::NumEntities(lf::base::RefEl ref_el_type) const {
  switch (ref_el_type) {
    case lf::base::RefEl::kPoint(): {
      return points_.size();
    }
    case lf::base::RefEl::kSegment(): {
      return segments_.size();
    }
    case lf::base::RefEl::kTria(): {
      return trias_.size();
    }
    case lf::base::RefEl::kQuad(): {
      return quads_.size();
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal entity type");
      break;
    }
  }
  return 0;
}